

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8b1c::ARTKeyEncodeDecodeTest_DoubleC0003NegInfinity_Test::
~ARTKeyEncodeDecodeTest_DoubleC0003NegInfinity_Test
          (ARTKeyEncodeDecodeTest_DoubleC0003NegInfinity_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, DoubleC0003NegInfinity) {
  using F = double;
  using U = std::uint64_t;
  constexpr auto ninf = -std::numeric_limits<F>::infinity();
  UNODB_EXPECT_EQ(sizeof(ninf), sizeof(double));
  UNODB_EXPECT_TRUE(std::numeric_limits<double>::is_iec559)
      << "IEEE 754 required";
  UNODB_EXPECT_LT(ninf, std::numeric_limits<double>::lowest());
  UNODB_EXPECT_TRUE(std::isinf(ninf));
  UNODB_EXPECT_FALSE(std::isnan(ninf));
  UNODB_EXPECT_EQ(unodb::detail::bit_cast<const U>(ninf),
                  0xfff0000000000000ULL);
  do_encode_decode_double_test(ninf);
}